

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  float fVar2;
  ImGuiWindow *this;
  ImDrawList *draw_list;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  ImU32 tab_id;
  ImU32 col;
  ImGuiID close_button_id;
  ImGuiTabItem *pIVar8;
  size_t sVar9;
  char *pcVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  ImGuiTabItemFlags flags_00;
  ImGuiTabItem *pIVar14;
  int iVar15;
  ImS8 IVar16;
  int iVar17;
  ImGuiCol idx;
  undefined7 uVar19;
  undefined8 uVar18;
  int iVar20;
  uint uVar21;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar22;
  uint uVar23;
  ImRect bb;
  bool held;
  bool hovered;
  ImRect local_98;
  uint local_88;
  ImU32 local_84;
  ImVec2 local_80;
  undefined1 local_78 [24];
  ImVec2 local_60;
  ImVec2 local_58;
  int local_4c;
  undefined8 local_48;
  bool *local_40;
  char *local_38;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar4 = GImGui;
  this = GImGui->CurrentWindow;
  if (this->SkipItems != false) {
    return false;
  }
  tab_id = TabBarCalcTabID((ImGuiTabBar *)(ulong)(uint)tab_bar->Flags,label);
  if ((p_open == (bool *)0x0) || (*p_open != false)) {
    local_40 = (bool *)0x0;
    uVar21 = flags;
    if (((uint)flags >> 0x14 & 1) == 0) {
      local_40 = p_open;
      uVar21 = flags | 0x100000;
    }
    if (p_open != (bool *)0x0) {
      uVar21 = flags;
    }
    IVar3 = TabItemCalcSize(label,local_40 != (bool *)0x0);
    local_78._8_4_ = extraout_XMM0_Dc;
    local_78._0_4_ = IVar3.x;
    local_78._4_4_ = IVar3.y;
    local_78._12_4_ = extraout_XMM0_Dd;
    pIVar8 = TabBarFindTabByID(tab_bar,tab_id);
    local_60 = (ImVec2)pIVar8;
    if (pIVar8 == (ImGuiTabItem *)0x0) {
      iVar13 = (tab_bar->Tabs).Size;
      if (iVar13 == (tab_bar->Tabs).Capacity) {
        if (iVar13 == 0) {
          iVar12 = 8;
        }
        else {
          iVar12 = iVar13 / 2 + iVar13;
        }
        iVar15 = iVar13 + 1;
        if (iVar13 + 1 < iVar12) {
          iVar15 = iVar12;
        }
        pIVar8 = (ImGuiTabItem *)MemAlloc((long)iVar15 << 5);
        pIVar14 = (tab_bar->Tabs).Data;
        if (pIVar14 != (ImGuiTabItem *)0x0) {
          memcpy(pIVar8,pIVar14,(long)(tab_bar->Tabs).Size << 5);
          MemFree((tab_bar->Tabs).Data);
        }
        (tab_bar->Tabs).Data = pIVar8;
        (tab_bar->Tabs).Capacity = iVar15;
        iVar13 = (tab_bar->Tabs).Size;
      }
      else {
        pIVar8 = (tab_bar->Tabs).Data;
      }
      pIVar14 = pIVar8 + iVar13;
      pIVar14->ID = 0;
      pIVar14->Flags = 0;
      pIVar14->LastFrameVisible = -1;
      pIVar14->LastFrameSelected = -1;
      pIVar8[iVar13].NameOffset = -1;
      pIVar8[iVar13].Offset = 0.0;
      pIVar8[iVar13].Width = 0.0;
      pIVar8[iVar13].ContentWidth = 0.0;
      iVar12 = (tab_bar->Tabs).Size;
      iVar13 = iVar12 + 1;
      (tab_bar->Tabs).Size = iVar13;
      if (iVar12 < 0) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x60e,"back","ImGui ASSERT FAILED: %s","Size > 0");
        iVar13 = (tab_bar->Tabs).Size;
      }
      pIVar14 = (tab_bar->Tabs).Data;
      pIVar8 = pIVar14 + (long)iVar13 + -1;
      pIVar8->ID = tab_id;
      pIVar14[(long)iVar13 + -1].Width = (float)local_78._0_4_;
      fVar22 = (float)local_78._0_4_;
    }
    else {
      pIVar14 = (tab_bar->Tabs).Data;
      fVar22 = (float)local_78._0_4_;
    }
    local_84 = tab_id;
    local_38 = label;
    if ((pIVar8 < pIVar14) || (pIVar14 + (tab_bar->Tabs).Size <= pIVar8)) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x625,"index_from_ptr","ImGui ASSERT FAILED: %s","it >= Data && it < Data + Size"
                 );
      pIVar14 = (tab_bar->Tabs).Data;
      fVar22 = (float)local_78._0_4_;
    }
    pcVar5 = local_38;
    tab_bar->LastTabItemIdx = (short)((uint)((int)pIVar8 - (int)pIVar14) >> 5);
    pIVar8->ContentWidth = fVar22;
    local_88 = tab_bar->Flags;
    iVar17 = tab_bar->PrevFrameVisible + 1;
    iVar13 = pIVar4->FrameCount;
    iVar20 = pIVar8->LastFrameVisible + 1;
    pIVar8->LastFrameVisible = iVar13;
    pIVar8->Flags = uVar21;
    iVar12 = (tab_bar->TabsNames).Buf.Size;
    iVar15 = iVar12 + -1;
    if (iVar12 == 0) {
      iVar15 = 0;
    }
    pIVar8->NameOffset = iVar15;
    sVar9 = strlen(local_38);
    ImGuiTextBuffer::append(&tab_bar->TabsNames,pcVar5,pcVar5 + sVar9 + 1);
    tab_id = local_84;
    uVar23 = tab_bar->Flags;
    bVar11 = iVar20 < iVar13;
    if (iVar20 < iVar13) {
      if ((((uVar23 & 2) != 0) && (tab_bar->NextSelectedTabId == 0)) &&
         ((iVar13 <= iVar17 || (tab_bar->SelectedTabId == 0)))) {
        tab_bar->NextSelectedTabId = local_84;
      }
    }
    else if ((uVar23 & 1) == 0) {
      fVar22 = tab_bar->OffsetNextTab;
      pIVar8->Offset = fVar22;
      tab_bar->OffsetNextTab = pIVar8->Width + (pIVar4->Style).ItemInnerSpacing.x + fVar22;
    }
    if (((uVar21 & 2) != 0) && (tab_bar->SelectedTabId != local_84)) {
      tab_bar->NextSelectedTabId = local_84;
    }
    uVar19 = (undefined7)((ulong)&tab_bar->TabsNames >> 8);
    if (tab_bar->VisibleTabId == local_84) {
      tab_bar->VisibleTabWasSubmitted = true;
      uVar18 = CONCAT71(uVar19,1);
    }
    else if ((tab_bar->SelectedTabId == 0 && iVar17 < iVar13) && ((tab_bar->Tabs).Size == 1)) {
      uVar18 = CONCAT71(uVar19,(uVar23 & 2) == 0);
    }
    else {
      uVar18 = 0;
    }
    if ((iVar13 <= iVar20) || (local_60 != (ImVec2)0x0 && iVar17 < iVar13)) {
      if (tab_bar->SelectedTabId == local_84) {
        pIVar8->LastFrameSelected = pIVar4->FrameCount;
      }
      local_60 = (this->DC).CursorPos;
      local_98.Max.x = pIVar8->Width;
      IVar3 = (tab_bar->BarRect).Min;
      local_98.Min.x = (float)(int)(pIVar8->Offset - tab_bar->ScrollingAnim) + IVar3.x;
      local_98.Min.y = IVar3.y + 0.0;
      IVar3.y = local_98.Min.y;
      IVar3.x = local_98.Min.x;
      (this->DC).CursorPos = IVar3;
      local_98.Max.x = local_98.Max.x + local_98.Min.x;
      local_98.Max.y = (float)local_78._4_4_ + local_98.Min.y;
      fVar22 = (tab_bar->BarRect).Min.x;
      fVar2 = (tab_bar->BarRect).Max.x;
      uVar23 = -(uint)(local_98.Min.x < fVar22 || fVar2 < local_98.Max.x);
      local_78._0_4_ = uVar23;
      local_4c = iVar20;
      local_48 = uVar18;
      if ((uVar23 & 1) != 0) {
        local_58.y = local_98.Min.y + -1.0;
        local_58.x = (float)(~-(uint)(fVar22 <= local_98.Min.x) & (uint)fVar22 |
                            -(uint)(fVar22 <= local_98.Min.x) & (uint)local_98.Min.x);
        local_80.x = fVar2;
        local_80.y = local_98.Max.y;
        PushClipRect(&local_58,&local_80,true);
      }
      local_58.x = local_98.Max.x - local_98.Min.x;
      local_58.y = local_98.Max.y - local_98.Min.y;
      IVar3 = (this->DC).CursorMaxPos;
      ItemSize(&local_58,(pIVar4->Style).FramePadding.y);
      (this->DC).CursorMaxPos = IVar3;
      bVar6 = ItemAdd(&local_98,tab_id,(ImRect *)0x0);
      if (!bVar6) {
        if ((local_78._0_16_ & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          PopClipRect();
        }
        (this->DC).CursorPos = local_60;
        return (bool)(char)local_48;
      }
      bVar6 = ButtonBehavior(&local_98,tab_id,(bool *)&local_58,(bool *)&local_80,
                             (uint)pIVar4->DragDropActive << 6 | 0x102);
      if (bVar6) {
        tab_bar->NextSelectedTabId = tab_id;
      }
      local_58.x._0_1_ = local_58.x._0_1_ | pIVar4->HoveredId == tab_id;
      bVar6 = SUB81(local_48,0);
      if (local_80.x._0_1_ == '\0') {
        bVar7 = local_4c < iVar13;
        SetItemAllowOverlap();
        bVar11 = local_80.x._0_1_ ^ 1 | bVar7;
      }
      pcVar5 = local_38;
      if (((((bVar11 & 1) == 0) && (bVar7 = IsMouseDragging(0,-1.0), bVar7)) &&
          (pIVar4->DragDropActive == false)) && ((tab_bar->Flags & 1) != 0)) {
        fVar22 = (pIVar4->IO).MouseDelta.x;
        if ((0.0 <= fVar22) ||
           (pIVar1 = &(pIVar4->IO).MousePos,
           local_98.Min.x < pIVar1->x || local_98.Min.x == pIVar1->x)) {
          if ((fVar22 <= 0.0) || ((pIVar4->IO).MousePos.x <= local_98.Max.x)) goto LAB_001e9cd0;
          IVar16 = '\x01';
        }
        else {
          IVar16 = -1;
        }
        if (tab_bar->ReorderRequestTabId != 0) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                      ,0x1b38,"TabBarQueueChangeTabOrder","ImGui ASSERT FAILED: %s",
                      "tab_bar->ReorderRequestTabId == 0");
        }
        tab_bar->ReorderRequestTabId = pIVar8->ID;
        tab_bar->ReorderRequestDir = IVar16;
      }
LAB_001e9cd0:
      draw_list = this->DrawList;
      idx = 0x22;
      if ((local_80.x._0_1_ == '\0') && (local_58.x._0_1_ == '\0')) {
        if (bVar6 == false) {
          idx = (uint)((local_88 >> 0x15 & 1) == 0) * 3 + 0x21;
        }
        else {
          idx = (uint)((local_88 >> 0x15 & 1) == 0) * 2 + 0x23;
        }
      }
      col = GetColorU32(idx,1.0);
      TabItemBackground(draw_list,&local_98,flags_00,col);
      RenderNavHighlight(&local_98,tab_id,1);
      bVar7 = IsItemHovered(8);
      if ((bVar7) &&
         ((bVar7 = IsMouseClicked(1,false), bVar7 || (bVar7 = IsMouseReleased(1), bVar7)))) {
        tab_bar->NextSelectedTabId = tab_id;
      }
      uVar21 = (uint)tab_bar->Flags >> 1 & 4 | uVar21;
      if (local_40 == (bool *)0x0) {
        TabItemLabelAndCloseButton
                  (draw_list,&local_98,uVar21,tab_bar->FramePadding,pcVar5,tab_id,0,bVar6);
      }
      else {
        close_button_id = ImGuiWindow::GetID(this,(void *)((ulong)tab_id + 1));
        bVar7 = TabItemLabelAndCloseButton
                          (draw_list,&local_98,uVar21,tab_bar->FramePadding,pcVar5,tab_id,
                           close_button_id,bVar6);
        if (bVar7) {
          *local_40 = false;
          if (tab_bar->VisibleTabId == pIVar8->ID) {
            if ((pIVar8->Flags & 1U) == 0) {
              pIVar8->LastFrameVisible = -1;
              tab_bar->SelectedTabId = 0;
              tab_bar->NextSelectedTabId = 0;
            }
          }
          else if ((pIVar8->Flags & 1U) != 0) {
            tab_bar->NextSelectedTabId = pIVar8->ID;
          }
        }
      }
      if ((local_78._0_16_ & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        PopClipRect();
      }
      (this->DC).CursorPos = local_60;
      if (pIVar4->HoveredId != tab_id) {
        return bVar6;
      }
      if (local_80.x._0_1_ != '\0') {
        return bVar6;
      }
      if (pIVar4->HoveredIdNotActiveTimer <= 0.5) {
        return bVar6;
      }
      bVar7 = IsItemHovered(0);
      if (!bVar7) {
        return bVar6;
      }
      if ((tab_bar->Flags & 0x20) != 0) {
        return bVar6;
      }
      if ((pIVar8->Flags & 0x10) != 0) {
        return bVar6;
      }
      pcVar10 = FindRenderedTextEnd(pcVar5,(char *)0x0);
      SetTooltip("%.*s",(ulong)(uint)((int)pcVar10 - (int)pcVar5),pcVar5);
      return bVar6;
    }
    PushItemFlag(0x18,true);
  }
  else {
    PushItemFlag(0x18,true);
    uVar18 = 0;
  }
  local_98.Max.x = 0.0;
  local_98.Max.y = 0.0;
  local_98.Min.x = 0.0;
  local_98.Min.y = 0.0;
  ItemAdd(&local_98,tab_id,(ImRect *)0x0);
  PopItemFlag();
  return SUB81(uVar18,0);
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render. We make a dummy call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (short)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // If we are not reorderable, always reset offset based on submission order.
    // (We already handled layout and sizing using the previous known order, but sizing is not affected by order!)
    if (!tab_appearing && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
    {
        tab->Offset = tab_bar->OffsetNextTab;
        tab_bar->OffsetNextTab += tab->Width + g.Style.ItemInnerSpacing.x;
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    size.x = tab->Width;
    window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    bool want_clip_rect = (bb.Min.x < tab_bar->BarRect.Min.x) || (bb.Max.x > tab_bar->BarRect.Max.x);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->BarRect.Min.x), bb.Min.y - 1), ImVec2(tab_bar->BarRect.Max.x, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = (ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, +1);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? window->GetID((void*)((intptr_t)id + 1)) : 0;
    bool just_closed = TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    return tab_contents_visible;
}